

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O0

bool __thiscall slang::ast::ASTContext::requireBooleanConvertible(ASTContext *this,Expression *expr)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  bool bVar1;
  compare_three_way_result_t<unsigned_int,_unsigned_int> cVar2;
  bitwidth_t bVar3;
  optional<unsigned_int> oVar4;
  long in_RSI;
  ASTContext *in_RDI;
  anon_class_8_1_898b66f3 isMaskOrRShift;
  Expression *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined1 uVar5;
  Type *in_stack_ffffffffffffff68;
  SourceLocation in_stack_ffffffffffffff80;
  SourceLocation in_stack_ffffffffffffff88;
  DiagCode in_stack_ffffffffffffff94;
  __unspec local_59;
  undefined4 in_stack_ffffffffffffffa8;
  _Storage<unsigned_int,_true> in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  bool local_1;
  
  bVar1 = Expression::bad((Expression *)
                          CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  if (bVar1) {
    local_1 = false;
  }
  else {
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x4edc45);
    bVar1 = Type::isBooleanConvertible(in_stack_ffffffffffffff68);
    if (bVar1) {
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x4edcda)
      ;
      bVar1 = Type::isFloating((Type *)0x4edce2);
      if (bVar1) {
        sourceRange_00.endLoc = in_stack_ffffffffffffff88;
        sourceRange_00.startLoc = in_stack_ffffffffffffff80;
        addDiag(in_RDI,in_stack_ffffffffffffff94,sourceRange_00);
        not_null<const_slang::ast::Type_*>::operator*
                  ((not_null<const_slang::ast::Type_*> *)0x4edd3a);
        ast::operator<<((Diagnostic *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        (Type *)CONCAT44(in_stack_ffffffffffffffac._M_value,
                                         in_stack_ffffffffffffffa8));
      }
      else {
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0x4edd5d);
        bVar1 = Type::isIntegral((Type *)CONCAT17(in_stack_ffffffffffffff67,
                                                  in_stack_ffffffffffffff60));
        uVar5 = false;
        if (bVar1) {
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0x4edd85);
          bVar3 = Type::getBitWidth(in_stack_ffffffffffffff68);
          uVar5 = false;
          if (1 < bVar3) {
            oVar4 = Expression::getEffectiveWidth(in_stack_ffffffffffffff58);
            in_stack_ffffffffffffffac._M_value =
                 oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>._M_payload;
            in_stack_ffffffffffffffb0 =
                 oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>._4_4_;
            in_stack_ffffffffffffffa8 = 1;
            cVar2 = std::operator<=><unsigned_int,_unsigned_int>
                              ((optional<unsigned_int> *)in_stack_ffffffffffffff68,
                               (uint *)CONCAT17(uVar5,in_stack_ffffffffffffff60));
            in_stack_ffffffffffffffb4 = CONCAT13(cVar2._M_value,(int3)in_stack_ffffffffffffffb4);
            std::__cmp_cat::__unspec::__unspec(&local_59,(__unspec *)0x0);
            uVar5 = std::operator>((char)((uint)in_stack_ffffffffffffffb4 >> 0x18));
          }
        }
        if (((bool)uVar5 != false) &&
           (bVar1 = requireBooleanConvertible::anon_class_8_1_898b66f3::operator()
                              ((anon_class_8_1_898b66f3 *)in_stack_ffffffffffffff68), !bVar1)) {
          addDiag(in_RDI,(DiagCode)0xc60007,*(SourceRange *)(in_RSI + 0x20));
          not_null<const_slang::ast::Type_*>::operator*
                    ((not_null<const_slang::ast::Type_*> *)0x4ede59);
          ast::operator<<((Diagnostic *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          (Type *)CONCAT44(in_stack_ffffffffffffffac._M_value,
                                           in_stack_ffffffffffffffa8));
        }
      }
      local_1 = true;
    }
    else {
      sourceRange.endLoc = in_stack_ffffffffffffff88;
      sourceRange.startLoc = in_stack_ffffffffffffff80;
      addDiag(in_RDI,in_stack_ffffffffffffff94,sourceRange);
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x4edcaf);
      ast::operator<<((Diagnostic *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      (Type *)CONCAT44(in_stack_ffffffffffffffac._M_value,in_stack_ffffffffffffffa8)
                     );
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool ASTContext::requireBooleanConvertible(const Expression& expr) const {
    if (expr.bad())
        return false;

    if (!expr.type->isBooleanConvertible()) {
        addDiag(diag::NotBooleanConvertible, expr.sourceRange) << *expr.type;
        return false;
    }
    else if (expr.type->isFloating()) {
        addDiag(diag::FloatBoolConv, expr.sourceRange) << *expr.type;
    }
    else if (expr.type->isIntegral() && expr.type->getBitWidth() > 1 &&
             expr.getEffectiveWidth() > 1u) {
        // Suppress the warning for cases of right shift and bitwise-AND,
        // as it's common practice to check for non-zero results like this:
        //   if (a & b) begin end
        //   if (a >> 2) begin end
        auto isMaskOrRShift = [&] {
            if (expr.kind == ExpressionKind::BinaryOp) {
                auto op = expr.as<BinaryExpression>().op;
                return op == BinaryOperator::BinaryAnd || op == BinaryOperator::LogicalShiftRight ||
                       op == BinaryOperator::ArithmeticShiftRight ||
                       op == BinaryOperator::BinaryXor || op == BinaryOperator::BinaryXnor;
            }
            return false;
        };

        if (!isMaskOrRShift())
            addDiag(diag::IntBoolConv, expr.sourceRange) << *expr.type;
    }

    return true;
}